

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

BVStatic<256UL> * __thiscall
BVStatic<2048ul>::GetRange<256ul>(BVStatic<2048ul> *this,BVIndex startOffset)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  BVStatic<256UL> *pBVar5;
  BVIndex startOffset_local;
  BVStatic<2048UL> *this_local;
  
  BVStatic<2048UL>::AssertRange((BVStatic<2048UL> *)this,startOffset);
  BVStatic<2048UL>::AssertRange((BVStatic<2048UL> *)this,startOffset + 0xff);
  BVar3 = BVUnitT<unsigned_long>::Offset(startOffset);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x224,"(BVUnit::Offset(startOffset) == 0)",
                       "BVUnit::Offset(startOffset) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = BVUnitT<unsigned_long>::Offset(0x100);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x225,"(BVUnit::Offset(rangeSize) == 0)","BVUnit::Offset(rangeSize) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pBVar5 = (BVStatic<256UL> *)BVStatic<2048UL>::BitsFromIndex((BVStatic<2048UL> *)this,startOffset);
  return pBVar5;
}

Assistant:

BVStatic<rangeSize> * GetRange(BVIndex startOffset) const
    {
        AssertRange(startOffset);
        AssertRange(startOffset + rangeSize - 1);

        // Start offset and size must be word-aligned
        Assert(BVUnit::Offset(startOffset) == 0);
        Assert(BVUnit::Offset(rangeSize) == 0);

        return (BVStatic<rangeSize> *)BitsFromIndex(startOffset);
    }